

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O2

bool QTestPrivate::appendCharBuffer(QTestCharBuffer *accumulator,QTestCharBuffer *more)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  QTestCharBuffer *buf;
  
  buf = more;
  uVar3 = appendCharBuffer::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)more,more);
  bVar2 = true;
  if (0 < (int)uVar3) {
    iVar4 = appendCharBuffer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)accumulator,buf);
    if (((int)(uVar3 + iVar4) < 0x200000) &&
       (bVar2 = QTestCharBuffer::resize(accumulator,uVar3 + iVar4 + 1), bVar2)) {
      pcVar1 = accumulator->buf;
      memcpy(pcVar1 + iVar4,more->buf,(ulong)uVar3);
      (pcVar1 + iVar4)[uVar3] = '\0';
      return true;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool appendCharBuffer(QTestCharBuffer *accumulator, const QTestCharBuffer &more)
{
    const auto bufsize = [](const QTestCharBuffer &buf) -> int {
        const int max = buf.size();
        return max > 0 ? int(qstrnlen(buf.constData(), max)) : 0;
    };
    const int extra = bufsize(more);
    if (extra <= 0)
        return true; // Nothing to do, fatuous success

    const int oldsize = bufsize(*accumulator);
    const int newsize = oldsize + extra + 1; // 1 for final '\0'
    if (newsize > MAXSIZE || !accumulator->resize(newsize))
        return false; // too big or unable to grow

    char *tail = accumulator->data() + oldsize;
    memcpy(tail, more.constData(), extra);
    tail[extra] = '\0';
    return true;
}